

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

void __thiscall wallet::anon_unknown_5::WalletLoaderImpl::registerRpcs(WalletLoaderImpl *this)

{
  size_t *psVar1;
  pointer pcVar2;
  Chain *pCVar3;
  string category;
  string name;
  Actor actor;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  args;
  CRPCCommand *pCVar4;
  _List_node_base *p_Var5;
  iterator __tmp;
  long in_FS_OFFSET;
  Span<const_CRPCCommand> SVar6;
  CRPCCommand *pCVar7;
  vector<std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>,std::allocator<std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>>>
  *this_00;
  list<CRPCCommand,_std::allocator<CRPCCommand>_> *plVar8;
  pointer in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff58 [16];
  WalletLoaderImpl *pWVar9;
  CRPCCommand *pCVar10;
  code *pcVar11;
  code *pcVar12;
  _Manager_type p_Var13;
  _Invoker_type in_stack_ffffffffffffff90;
  long in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  pointer ppVar14;
  _Alloc_hider local_48;
  undefined8 local_38;
  
  local_38 = *(size_type *)(in_FS_OFFSET + 0x28);
  SVar6 = GetWalletRPCCommands();
  pCVar4 = SVar6.m_data;
  if (SVar6.m_size != 0) {
    pCVar7 = pCVar4 + SVar6.m_size;
    plVar8 = &this->m_rpc_commands;
    this_00 = (vector<std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>,std::allocator<std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>>>
               *)&this->m_rpc_handlers;
    do {
      p_Var5 = (_List_node_base *)operator_new(0x90);
      ppVar14 = (pointer)&local_48;
      pcVar2 = (pCVar4->category)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&stack0xffffffffffffffa8,pcVar2,
                 pcVar2 + (pCVar4->category)._M_string_length);
      p_Var13 = (_Manager_type)&stack0xffffffffffffff98;
      pcVar2 = (pCVar4->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&stack0xffffffffffffff88,pcVar2,pcVar2 + (pCVar4->name)._M_string_length)
      ;
      pcVar12 = _GLOBAL__N_1::std::
                _Function_handler<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/interfaces.cpp:581:73)>
                ::_M_invoke;
      pcVar11 = _GLOBAL__N_1::std::
                _Function_handler<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/interfaces.cpp:581:73)>
                ::_M_manager;
      pWVar9 = this;
      pCVar10 = pCVar4;
      _GLOBAL__N_1::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                *)&stack0xffffffffffffff50,&pCVar4->argNames);
      category._M_string_length = (size_type)this_00;
      category._M_dataplus._M_p = (pointer)pCVar7;
      category.field_2._M_allocated_capacity = (size_type)plVar8;
      category.field_2._8_8_ = in_stack_ffffffffffffff50;
      name.field_2._M_allocated_capacity = (size_type)pWVar9;
      name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff58._0_8_;
      name._M_string_length = in_stack_ffffffffffffff58._8_8_;
      name.field_2._8_8_ = pCVar10;
      actor.super__Function_base._M_functor._8_8_ = pcVar12;
      actor.super__Function_base._M_functor._M_unused._M_function_pointer = pcVar11;
      actor.super__Function_base._M_manager = p_Var13;
      actor._M_invoker = in_stack_ffffffffffffff90;
      args.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffffa0;
      args.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff98;
      args.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar14;
      CRPCCommand::CRPCCommand
                ((CRPCCommand *)(p_Var5 + 1),category,name,actor,args,
                 (intptr_t)&stack0xffffffffffffffa8);
      _GLOBAL__N_1::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 *)&stack0xffffffffffffff50);
      if (pcVar11 != (code *)0x0) {
        (*pcVar11)(&stack0xffffffffffffff68,&stack0xffffffffffffff68,3);
      }
      if (p_Var13 != (_Manager_type)&stack0xffffffffffffff98) {
        operator_delete(p_Var13,in_stack_ffffffffffffff98 + 1);
      }
      if (ppVar14 != (pointer)&local_48) {
        operator_delete(ppVar14,(ulong)(local_48._M_p + 1));
      }
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(this->m_rpc_commands).super__List_base<CRPCCommand,_std::allocator<CRPCCommand>_>.
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      pCVar3 = (this->m_context).chain;
      (**(code **)(*(long *)pCVar3 + 0x158))
                ((string *)&stack0xffffffffffffffa8,pCVar3,
                 (this->m_rpc_commands).super__List_base<CRPCCommand,_std::allocator<CRPCCommand>_>.
                 _M_impl._M_node.super__List_node_base._M_prev + 1);
      std::
      vector<std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>,std::allocator<std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>>>
      ::emplace_back<std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>>
                (this_00,(unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_>
                          *)&stack0xffffffffffffffa8);
      if (ppVar14 != (pointer)0x0) {
        (**(code **)((ppVar14->first)._M_dataplus._M_p + 8))();
      }
      pCVar4 = pCVar4 + 1;
    } while (pCVar4 != pCVar7);
  }
  if (*(size_type *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void registerRpcs() override
    {
        for (const CRPCCommand& command : GetWalletRPCCommands()) {
            m_rpc_commands.emplace_back(command.category, command.name, [this, &command](const JSONRPCRequest& request, UniValue& result, bool last_handler) {
                JSONRPCRequest wallet_request = request;
                wallet_request.context = &m_context;
                return command.actor(wallet_request, result, last_handler);
            }, command.argNames, command.unique_id);
            m_rpc_handlers.emplace_back(m_context.chain->handleRpc(m_rpc_commands.back()));
        }
    }